

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_round2.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b7780::checkn<unsigned_int,_16U>::operator()(checkn<unsigned_int,_16U> *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_b8;
  uint local_b0 [2];
  Message local_a8;
  uint local_a0;
  uint32_t local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  uint local_80 [2];
  Message local_78;
  uint32_t local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  uint local_4c [5];
  Message local_38;
  uint32_t local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint v;
  checkn<unsigned_int,_16U> *this_local;
  
  checkn<unsigned_int,_15U>::operator()
            ((checkn<unsigned_int,_15U> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x10000;
  local_2c = pstore::round_to_power_of_2(0xffff);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_28,"pstore::round_to_power_of_2 (T{v - 1})","v",&local_2c,
             (uint *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pMVar2 = testing::Message::operator<<(&local_38,(char (*) [5])"(1<<");
    local_4c[1] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_4c + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [22])")-1 should become 1<<");
    local_4c[0] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_4c);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_6c = pstore::round_to_power_of_2(0x10000);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_68,"pstore::round_to_power_of_2 (T{v + 0})","v",&local_6c,
             (uint *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pMVar2 = testing::Message::operator<<(&local_78,(char (*) [5])"(1<<");
    local_80[1] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_80 + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [20])") should become 1<<");
    local_80[0] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_9c = pstore::round_to_power_of_2(0x10001);
  local_a0 = 0x20000;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"pstore::round_to_power_of_2 (T{v + 1})","T{1} << (Shift + 1)",
             &local_9c,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pMVar2 = testing::Message::operator<<(&local_a8,(char (*) [5])"(1<<");
    local_b0[1] = 0x10;
    pMVar2 = testing::Message::operator<<(pMVar2,local_b0 + 1);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [22])")+1 should become 1<<");
    local_b0[0] = 0x11;
    pMVar2 = testing::Message::operator<<(pMVar2,local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_round2.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

void operator() () const {
            checkn<T, Shift - 1U>{}();

            constexpr auto v = T{1} << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v - 1}), v)
                << "(1<<" << Shift << ")-1 should become 1<<" << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 0}), v)
                << "(1<<" << Shift << ") should become 1<<" << Shift;
            EXPECT_EQ (pstore::round_to_power_of_2 (T{v + 1}), T{1} << (Shift + 1))
                << "(1<<" << Shift << ")+1 should become 1<<" << (Shift + 1);
        }